

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar1;
  pointer pbVar2;
  bool bVar3;
  uint uVar4;
  TargetType targetType;
  int iVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  ulong uVar10;
  ulong uVar11;
  uint c;
  pointer b;
  char cVar12;
  undefined7 in_register_00000089;
  string_view source;
  string_view source_00;
  string output;
  cmRulePlaceholderExpander *local_298;
  string launcher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string cmd;
  string val;
  string workingDir;
  string local_1e8;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comment
  ;
  
  if ((int)CONCAT71(in_register_00000089,echo_comment) != 0) {
    cmCustomCommandGenerator::GetComment_abi_cxx11_(&comment,ccg);
    if (comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      AppendEcho(this,commands,(string *)&comment,EchoGenerate,(EchoProgress *)0x0);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&comment);
  }
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&dir,(string *)psVar6);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&workingDir,ccg);
  if (workingDir._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&dir);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)&dir);
  }
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[6])(&local_298,this);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  c = 0;
  do {
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar4 <= c) {
      CreateCDCommand(this,&commands1,&dir,relative);
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      bVar3 = cmCustomCommand::GetJobserverAware(ccg->CC);
      if (bVar3) {
        iVar5 = (*pcVar1->_vptr_cmGlobalGenerator[0xf])(pcVar1);
        pbVar2 = commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((char)iVar5 != '\0') {
          for (b = commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; b != pbVar2; b = b + 1) {
            cmStrCat<char_const(&)[2],std::__cxx11::string_const&>
                      ((string *)&comment,(char (*) [2])0x76044c,b);
            std::__cxx11::string::operator=((string *)b,(string *)&comment);
            std::__cxx11::string::~string((string *)&comment);
          }
        }
      }
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (commands,&commands1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands1);
      if (local_298 != (cmRulePlaceholderExpander *)0x0) {
        (*(local_298->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
      }
      std::__cxx11::string::~string((string *)&workingDir);
      std::__cxx11::string::~string((string *)&dir);
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&cmd,ccg,c);
    if (cmd._M_string_length != 0) {
      bVar3 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar3) {
        comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p =
             (_Alloc_hider)
             ((long)&comment.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
        comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = 0;
        comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_1_ = 0;
        if (cmd._M_string_length < 5) {
LAB_004d2f56:
          bVar3 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&val,(ulong)&cmd);
          cmsys::SystemTools::LowerCase(&launcher,&val);
          std::__cxx11::string::operator=((string *)&comment,(string *)&launcher);
          std::__cxx11::string::~string((string *)&launcher);
          std::__cxx11::string::~string((string *)&val);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&comment,".bat");
          if (!bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&comment,".cmd");
            if (!bVar3) goto LAB_004d2f56;
          }
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)&comment);
      }
      else {
        bVar3 = false;
      }
      cmsys::SystemTools::ReplaceString(&cmd,"/./","/");
      cVar12 = (char)&cmd;
      lVar7 = std::__cxx11::string::find(cVar12,0x2f);
      if (workingDir._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)&comment,(cmOutputConverter *)this,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&comment);
        std::__cxx11::string::~string((string *)&comment);
      }
      lVar8 = std::__cxx11::string::find(cVar12,0x2f);
      if ((lVar7 != -1) && (lVar8 == -1)) {
        cmStrCat<char_const(&)[3],std::__cxx11::string&>
                  ((string *)&comment,(char (*) [3])0x70a99d,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&comment);
        std::__cxx11::string::~string((string *)&comment);
      }
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      launcher._M_string_length = 0;
      launcher.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&comment,"RULE_LAUNCH_CUSTOM",(allocator<char> *)&local_1e8);
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_1a8);
      psVar6 = cmMakefile::GetSafeDefinition(this_00,&output);
      cmLocalGenerator::GetRuleLauncher
                (&val,(cmLocalGenerator *)this,target,(string *)&comment,psVar6);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&comment);
      if (val._M_string_length != 0) {
        memset((RuleVariables *)&comment,0,0x158);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(psVar6->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(target);
        psVar6 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
        comment.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        pvVar9 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        if ((pvVar9->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar9->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&output);
          if (workingDir._M_string_length == 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      (&local_1e8,(cmOutputConverter *)this,&output);
            std::__cxx11::string::operator=((string *)&output,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          source._M_str = output._M_dataplus._M_p;
          source._M_len = output._M_string_length;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_1e8,(cmOutputConverter *)this,source,SHELL,false);
          std::__cxx11::string::operator=((string *)&output,(string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        std::__cxx11::string::_M_assign((string *)&launcher);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_298,(cmOutputConverter *)this,&launcher,(RuleVariables *)&comment);
        if (launcher._M_string_length != 0) {
          std::__cxx11::string::append((char *)&launcher);
        }
        std::__cxx11::string::~string((string *)&output);
      }
      MaybeConvertWatcomShellCommand((string *)&comment,this,&cmd);
      if (comment.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length == 0) {
        source_00._M_str = cmd._M_dataplus._M_p;
        source_00._M_len = cmd._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&output,(cmOutputConverter *)this,source_00,SHELL,false);
        std::__cxx11::string::operator=((string *)&comment,(string *)&output);
        std::__cxx11::string::~string((string *)&output);
      }
      std::operator+(&output,&launcher,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&output);
      std::__cxx11::string::~string((string *)&output);
      cmCustomCommandGenerator::AppendArguments(ccg,c,&cmd);
      if (content != (ostream *)0x0) {
        std::operator<<(content,cmd._M_dataplus._M_p + launcher._M_string_length);
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar10 = std::__cxx11::string::find(cVar12,0x7b);
        if ((uVar10 != 0xffffffffffffffff) && (uVar10 < cmd._M_string_length - 1)) {
          uVar11 = std::__cxx11::string::find(cVar12,0x7d);
          if (uVar10 < uVar11) {
            std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&cmd);
            std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&cmd);
            cmStrCat<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                      (&output,&local_1e8,(char (*) [4])"{{}",&local_1a8);
            std::__cxx11::string::operator=((string *)&cmd,(string *)&output);
            std::__cxx11::string::~string((string *)&output);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
        }
      }
      if (launcher._M_string_length == 0) {
        if (bVar3) {
          cmStrCat<char_const(&)[6],std::__cxx11::string&>(&output,(char (*) [6])"call ",&cmd);
        }
        else {
          bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar3) || (*cmd._M_dataplus._M_p != '\"')) goto LAB_004d33ad;
          cmStrCat<char_const(&)[14],std::__cxx11::string&>
                    (&output,(char (*) [14])"echo >nul && ",&cmd);
        }
        std::__cxx11::string::operator=((string *)&cmd,(string *)&output);
        std::__cxx11::string::~string((string *)&output);
      }
LAB_004d33ad:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands1,
                 &cmd);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&launcher);
    }
    std::__cxx11::string::~string((string *)&cmd);
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    if (cm::optional<std::string> comment = ccg.GetComment()) {
      this->AppendEcho(commands, *comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      std::string val = this->GetRuleLauncher(
        target, "RULE_LAUNCH_CUSTOM",
        this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);

  // Prefix the commands with the jobserver prefix "+"
  if (ccg.GetCC().GetJobserverAware() && gg->IsGNUMakeJobServerAware()) {
    std::transform(commands1.begin(), commands1.end(), commands1.begin(),
                   [](std::string const& cmd) { return cmStrCat("+", cmd); });
  }

  // push back the custom commands
  cm::append(commands, commands1);
}